

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

atomic<google::protobuf::internal::SerialArena_*> * __thiscall
google::protobuf::internal::ThreadSafeArena::SerialArenaChunk::arena
          (SerialArenaChunk *this,uint32_t i)

{
  uint32_t t;
  LogMessage *pLVar1;
  char *p;
  CopyConst<char,_ElementType<2UL>_> *pCVar2;
  layout_type local_78;
  undefined1 local_50 [16];
  LogMessageFatal local_40 [23];
  Voidify local_29;
  uint local_28;
  uint local_24;
  string *local_20;
  string *absl_log_internal_check_op_result;
  SerialArenaChunk *pSStack_10;
  uint32_t i_local;
  SerialArenaChunk *this_local;
  
  absl_log_internal_check_op_result._4_4_ = i;
  pSStack_10 = this;
  local_24 = absl::lts_20240722::log_internal::GetReferenceableValue(i);
  t = capacity(this);
  local_28 = absl::lts_20240722::log_internal::GetReferenceableValue(t);
  local_20 = absl::lts_20240722::log_internal::Check_LTImpl<unsigned_int,unsigned_int>
                       (&local_24,&local_28,"i < capacity()");
  if (local_20 != (string *)0x0) {
    local_50 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_20);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/arena.cc"
               ,0x1dc,local_50._0_8_,local_50._8_8_);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_40);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_29,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
  }
  Layout(&local_78,this);
  p = ptr(this);
  pCVar2 = absl::lts_20240722::container_internal::internal_layout::
           LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader,std::atomic<void*>,std::atomic<google::protobuf::internal::SerialArena*>>,std::integer_sequence<unsigned_long>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>>
           ::Pointer<2ul,char>((LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader,std::atomic<void*>,std::atomic<google::protobuf::internal::SerialArena*>>,std::integer_sequence<unsigned_long>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                                *)&local_78,p);
  return pCVar2 + absl_log_internal_check_op_result._4_4_;
}

Assistant:

std::atomic<SerialArena*>& arena(uint32_t i) {
    ABSL_DCHECK_LT(i, capacity());
    return Layout().Pointer<kArenas>(ptr())[i];
  }